

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Type __thiscall wasm::TranslateToFuzzReader::getSingleConcreteType(TranslateToFuzzReader *this)

{
  HeapType heapType;
  WeightedOption rest_1;
  WeightedOption rest_2;
  bool bVar1;
  Nullability nullable;
  value_type *pvVar2;
  FeatureOptions<wasm::Type> *pFVar3;
  Type TVar4;
  WeightedOption weightedOption;
  WeightedOption weightedOption_00;
  WeightedOption rest;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  local_d8;
  Type local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  Type local_80;
  Type local_78;
  Type local_70;
  Type local_68;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  
  if ((((byte)this->wasm[0x179] & 1) != 0) &&
     ((this->interestingHeapTypes).
      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->interestingHeapTypes).
      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar1 = Random::oneIn(&this->random,3);
    if (bVar1) {
      pvVar2 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (&this->random,&this->interestingHeapTypes);
      heapType.id = pvVar2->id;
      nullable = getNullability(this);
      Type::Type(&local_a8,heapType,nullable,Inexact);
      return (Type)local_a8.id;
    }
  }
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = 4;
  uStack_98 = 4;
  local_90 = 5;
  uStack_88 = 4;
  rest_1.weight = 4;
  rest_1.option.id = 4;
  rest_2.weight = 4;
  rest_2.option.id = 5;
  weightedOption.weight = 4;
  weightedOption.option.id = 2;
  rest.weight = 4;
  rest.option.id = 3;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar3 = Random::FeatureOptions<wasm::Type>::
           add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
                     ((FeatureOptions<wasm::Type> *)&local_d8,(FeatureSet)0x0,weightedOption,rest,
                      rest_1,rest_2);
  weightedOption_00.weight = 2;
  weightedOption_00.option.id = 6;
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(pFVar3,(FeatureSet)0x8,weightedOption_00);
  Type::Type(&local_80,(HeapType)0x10,Nullable,Inexact);
  Type::Type(&local_78,(HeapType)0x8,Nullable,Inexact);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                     (pFVar3,(FeatureSet)0x100,local_80,local_78);
  Type::Type(&local_70,(HeapType)0x48,Nullable,Inexact);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(pFVar3,(FeatureSet)0x40,local_70);
  Type::Type(&local_68,(HeapType)0x20,Nullable,Inexact);
  Type::Type(&local_60,(HeapType)0x28,Nullable,Inexact);
  Type::Type(&local_58,(HeapType)0x28,NonNullable,Inexact);
  Type::Type(&local_50,(HeapType)0x30,Nullable,Inexact);
  Type::Type(&local_48,(HeapType)0x38,Nullable,Inexact);
  Type::Type(&local_40,(HeapType)0x38,NonNullable,Inexact);
  Type::Type(&local_38,(HeapType)0x40,Nullable,Inexact);
  Type::Type(&local_30,(HeapType)0x40,NonNullable,Inexact);
  pFVar3 = Random::FeatureOptions<wasm::Type>::
           add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                     (pFVar3,(FeatureSet)0x500,local_68,local_60,local_58,local_50,local_48,local_40
                      ,local_38,local_30);
  Type::Type(&local_28,(HeapType)0x50,Nullable,Inexact);
  Type::Type(&local_20,(HeapType)0x50,NonNullable,Inexact);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                     (pFVar3,(FeatureSet)0x4000,local_28,local_20);
  TVar4 = Random::pick<wasm::Type>(&this->random,pFVar3);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  ::~_Rb_tree(&local_d8);
  return (Type)TVar4.id;
}

Assistant:

Type TranslateToFuzzReader::getSingleConcreteType() {
  if (wasm.features.hasReferenceTypes() && !interestingHeapTypes.empty() &&
      oneIn(3)) {
    auto heapType = pick(interestingHeapTypes);
    auto nullability = getNullability();
    return Type(heapType, nullability);
  }
  // Skip (ref func|extern|i31|exn) because there is no way to create them in
  // globals. TODO
  using WeightedOption = FeatureOptions<Type>::WeightedOption;
  return pick(FeatureOptions<Type>()
                .add(FeatureSet::MVP,
                     WeightedOption{Type::i32, VeryImportant},
                     WeightedOption{Type::i64, VeryImportant},
                     WeightedOption{Type::f32, VeryImportant},
                     WeightedOption{Type::f64, VeryImportant})
                .add(FeatureSet::SIMD, WeightedOption{Type::v128, Important})
                .add(FeatureSet::ReferenceTypes,
                     Type(HeapType::func, Nullable),
                     Type(HeapType::ext, Nullable))
                .add(FeatureSet::ExceptionHandling,
                     // Type(HeapType::exn, NonNullable),
                     Type(HeapType::exn, Nullable))
                .add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                     // Type(HeapType::func, NonNullable),
                     // Type(HeapType::ext, NonNullable),
                     Type(HeapType::any, Nullable),
                     // Type(HeapType::any, NonNullable),
                     Type(HeapType::eq, Nullable),
                     Type(HeapType::eq, NonNullable),
                     Type(HeapType::i31, Nullable),
                     // Type(HeapType::i31, NonNullable),
                     Type(HeapType::struct_, Nullable),
                     Type(HeapType::struct_, NonNullable),
                     Type(HeapType::array, Nullable),
                     Type(HeapType::array, NonNullable))
                .add(FeatureSet::Strings,
                     Type(HeapType::string, Nullable),
                     Type(HeapType::string, NonNullable)));
}